

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O1

void __thiscall
duckdb::HashAggregateDistinctFinalizeEvent::Schedule(HashAggregateDistinctFinalizeEvent *this)

{
  PhysicalHashAggregate *op;
  HashAggregateGlobalSinkState *state_p;
  int32_t val;
  idx_t iVar1;
  TaskScheduler *this_00;
  unsigned_long uVar2;
  type pipeline;
  HashAggregateDistinctFinalizeTask *this_01;
  pointer *__ptr;
  enable_shared_from_this<duckdb::Task> *object;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> tasks;
  _Head_base<0UL,_duckdb::HashAggregateDistinctFinalizeTask_*,_false> local_b8;
  HashAggregateDistinctFinalizeEvent *local_b0;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_a8;
  enable_shared_from_this<duckdb::Event> local_88;
  shared_ptr<duckdb::Event,_true> local_78;
  enable_shared_from_this<duckdb::Event> *local_68;
  shared_ptr<duckdb::Pipeline,_true> *local_60;
  Task *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_48;
  
  iVar1 = CreateGlobalSources(this);
  local_b0 = this;
  this_00 = TaskScheduler::GetScheduler(this->context);
  val = TaskScheduler::NumberOfThreads(this_00);
  uVar2 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  if (iVar1 < uVar2) {
    uVar2 = iVar1;
  }
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (uVar2 != 0) {
    local_60 = &(local_b0->super_BasePipelineEvent).pipeline;
    local_68 = &(local_b0->super_BasePipelineEvent).super_Event.
                super_enable_shared_from_this<duckdb::Event>;
    do {
      pipeline = shared_ptr<duckdb::Pipeline,_true>::operator*(local_60);
      enable_shared_from_this<duckdb::Event>::shared_from_this(&local_88);
      op = local_b0->op;
      state_p = local_b0->gstate;
      this_01 = (HashAggregateDistinctFinalizeTask *)operator_new(0xa0);
      local_78.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_88.__weak_this_.internal.
           super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_88.__weak_this_.internal.
              super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_88.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_88.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      HashAggregateDistinctFinalizeTask::HashAggregateDistinctFinalizeTask
                (this_01,pipeline,&local_78,op,state_p);
      local_b8._M_head_impl = this_01;
      if (local_78.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      ::std::__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<duckdb::HashAggregateDistinctFinalizeTask,std::default_delete<duckdb::HashAggregateDistinctFinalizeTask>,void>
                ((__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2> *)&local_58,
                 (unique_ptr<duckdb::HashAggregateDistinctFinalizeTask,_std::default_delete<duckdb::HashAggregateDistinctFinalizeTask>_>
                  *)&local_b8);
      object = &local_58->super_enable_shared_from_this<duckdb::Task>;
      if (local_58 == (Task *)0x0) {
        object = (enable_shared_from_this<duckdb::Task> *)0x0;
      }
      shared_ptr<duckdb::Task,_true>::__enable_weak_this<duckdb::Task,_duckdb::Task,_0>
                ((shared_ptr<duckdb::Task,_true> *)&local_58,object,local_58);
      ::std::
      vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
      ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
                ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                  *)&local_a8,(shared_ptr<duckdb::Task,_true> *)&local_58);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
      if (local_b8._M_head_impl != (HashAggregateDistinctFinalizeTask *)0x0) {
        (*((local_b8._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task[1])();
      }
      local_b8._M_head_impl = (HashAggregateDistinctFinalizeTask *)0x0;
      if (local_88.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.__weak_this_.internal.
                   super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_a8.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_a8.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_a8.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Event::SetTasks((Event *)local_b0,
                  (vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_a8);
  return;
}

Assistant:

void HashAggregateDistinctFinalizeEvent::Schedule() {
	auto n_tasks = CreateGlobalSources();
	n_tasks = MinValue<idx_t>(n_tasks, NumericCast<idx_t>(TaskScheduler::GetScheduler(context).NumberOfThreads()));
	vector<shared_ptr<Task>> tasks;
	for (idx_t i = 0; i < n_tasks; i++) {
		tasks.push_back(make_uniq<HashAggregateDistinctFinalizeTask>(*pipeline, shared_from_this(), op, gstate));
	}
	SetTasks(std::move(tasks));
}